

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2e991::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::
TestBody(BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  raw_ostream *prVar3;
  char *pcVar4;
  char *in_R9;
  StringRef name;
  AssertHelper local_5f8;
  Message local_5f0;
  uint local_5e4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e0;
  size_type local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar;
  undefined1 local_590 [8];
  Optional<llbuild::buildsystem::BuildValue> result;
  thread local_500;
  thread cancelThread;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  string local_4e8;
  AssertHelper local_4c8;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_;
  bool local_491;
  bool loadingResult;
  BuildSystem local_488;
  BuildSystem system;
  MockBuildSystemDelegate delegate;
  undefined1 local_3f0 [8];
  BuildKey keyToBuild;
  undefined1 local_3c0 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_348;
  Twine local_330;
  Twine local_318;
  string local_300;
  StringRef local_2e0;
  undefined1 local_2d0 [8];
  SmallString<256U> manifest;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_180 [8];
  string outputFile;
  undefined1 local_150 [8];
  TmpDir tempDir;
  BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test *this_local;
  
  tempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_150,stack0xfffffffffffffea0);
  llbuild::TmpDir::str_abi_cxx11_((string *)&__range1,(TmpDir *)local_150);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "/output.txt");
  std::__cxx11::string::~string((string *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    if (*(char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                 InlineElts._248_8_ == '\\') {
      *(char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
               InlineElts._248_8_ = '/';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  llbuild::TmpDir::str_abi_cxx11_(&local_300,(TmpDir *)local_150);
  uVar2 = std::__cxx11::string::data();
  local_2e0.Data = (char *)uVar2;
  uVar2 = std::__cxx11::string::length();
  local_2e0.Length = uVar2;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_2d0,local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  llvm::Twine::Twine(&local_318,"manifest.llbuild");
  llvm::Twine::Twine(&local_330,"");
  llvm::Twine::Twine(&local_348,"");
  llvm::Twine::Twine((Twine *)&ec._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_2d0,&local_318,&local_330,&local_348,(Twine *)&ec._M_cat
            );
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2d0);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_3c0,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    llvm::raw_ostream::operator<<
              ((raw_ostream *)local_3c0,
               "client:\n  name: mock\n\ncommands:\n  WAIT:\n    tool: shell\n    deps: \"/tmp/deps.info\"\n    deps-style: dependency-info\n    inputs: [\"<cleanup>\"]\n"
              );
    prVar3 = llvm::raw_ostream::operator<<((raw_ostream *)local_3c0,"    outputs: [\"");
    prVar3 = llvm::raw_ostream::operator<<(prVar3,(string *)local_180);
    llvm::raw_ostream::operator<<(prVar3,"\"]\n");
    llvm::raw_ostream::operator<<((raw_ostream *)local_3c0,"    description: \"WAIT\"\n    args:\n")
    ;
    prVar3 = llvm::raw_ostream::operator<<((raw_ostream *)local_3c0,"      touch ");
    prVar3 = llvm::raw_ostream::operator<<(prVar3,(string *)local_180);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    llvm::raw_ostream::operator<<((raw_ostream *)local_3c0,"      sleep 9999\n");
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_3c0);
    pcVar4 = (char *)strlen("WAIT");
    name.Length = (size_t)pcVar4;
    name.Data = pcVar4;
    llbuild::buildsystem::BuildKey::makeCommand((BuildKey *)local_3f0,(BuildKey *)"WAIT",name);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system,false);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&local_488,(BuildSystemDelegate *)&system,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&stack0xfffffffffffffb70);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                 *)&stack0xfffffffffffffb70);
    join_0x00000010_0x00000000_ =
         llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2d0);
    local_491 = llbuild::buildsystem::BuildSystem::loadDescription
                          (&local_488,join_0x00000010_0x00000000_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4b8,&local_491,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
    if (!bVar1) {
      testing::Message::Message(&local_4c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4e8,(internal *)local_4b8,(AssertionResult *)"loadingResult","false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x1b0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      testing::Message::~Message(&local_4c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
    if (bVar1) {
      llbuild::basic::createLocalFileSystem();
      result.Storage._112_8_ = &cancelThread;
      std::thread::
      thread<(anonymous_namespace)::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::TestBody()::__0,,void>
                (&local_500,(type *)&result.Storage.hasVal);
      llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&gtest_ar.message_,(BuildKey *)local_3f0)
      ;
      llbuild::buildsystem::BuildSystem::build
                ((Optional<llbuild::buildsystem::BuildValue> *)local_590,&local_488,
                 (BuildKey *)&gtest_ar.message_);
      llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar.message_);
      std::thread::join();
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                (&local_5e0,(MockBuildSystemDelegate *)&system);
      local_5c8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_5e0);
      local_5e4 = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_5c0,"delegate.getMessages().size()","0U",&local_5c8,&local_5e4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
      if (!bVar1) {
        testing::Message::Message(&local_5f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x1c6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
        testing::internal::AssertHelper::~AssertHelper(&local_5f8);
        testing::Message::~Message(&local_5f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
      llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
                ((Optional<llbuild::buildsystem::BuildValue> *)local_590);
      std::thread::~thread(&local_500);
      std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
      ::~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                     *)&cancelThread);
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&local_488);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system);
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_3f0);
    llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_2d0);
    std::__cxx11::string::~string((string *)local_180);
    llbuild::TmpDir::~TmpDir((TmpDir *)local_150);
    return;
  }
  __assert_fail("!ec",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                ,0x198,
                "virtual void (anonymous namespace)::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::TestBody()"
               );
}

Assistant:

TEST(BuildSystemTaskTests, doesNotProcessDependenciesAfterCancellation) {
  TmpDir tempDir(__func__);

  std::string outputFile = tempDir.str() + "/output.txt";
  for (auto& c : outputFile) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << "client:\n"
"  name: mock\n"
"\n"
"commands:\n"
"  WAIT:\n"
"    tool: shell\n"
"    deps: \"/tmp/deps.info\"\n"
"    deps-style: dependency-info\n"
"    inputs: [\"<cleanup>\"]\n";

    os << "    outputs: [\"" << outputFile << "\"]\n";
    os << "    description: \"WAIT\"\n"
"    args:\n";

    os << "      touch " << outputFile << "\n";
    os << "      sleep 9999\n";
  }

  auto keyToBuild = BuildKey::makeCommand("WAIT");
  MockBuildSystemDelegate delegate;
  BuildSystem system(delegate, basic::createLocalFileSystem());
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);

  std::unique_ptr<llbuild::basic::FileSystem> fs = llbuild::basic::createLocalFileSystem();
  std::thread cancelThread([&] {
    // Busy wait until `outputFile` appears which indicates that `yes` is
    // running.
    time_t start = ::time(NULL);
    while (fs->getFileInfo(outputFile).isMissing()) {
      if (::time(NULL) > start + 5) {
        // We can't fail gracefully because the `LaneBasedExecutionQueue` will
        // always wait for spawned processes to exit
        abort();
      }
    }

    system.cancel();
  });

  auto result = system.build(keyToBuild);

  cancelThread.join();
  // This is what we are testing for, if dependencies were processed, an error would occur during the build
  ASSERT_EQ(delegate.getMessages().size(), 0U);
}